

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O0

bool wasm::Match::Internal::
     Components<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<bool>_>_>
     ::match(matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>_> *candidate,
            SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<bool>_>_>
            *matchers)

{
  bool bVar1;
  int32_t iVar2;
  bool local_8a;
  Literal local_68;
  Literal local_40;
  GetComponent<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>,_0> local_21;
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<bool>_>_> *local_20;
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<bool>_>_>
  *matchers_local;
  matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>_> *candidate_local;
  
  local_20 = matchers;
  matchers_local =
       (SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<bool>_>_> *)
       candidate;
  wasm::Literal::Literal(&local_40,candidate);
  iVar2 = GetComponent<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>,_0>::operator()
                    (&local_21,&local_40);
  bVar1 = Matcher<wasm::Match::Internal::AnyKind<bool>_>::matches(&matchers->curr,iVar2 != 0);
  local_8a = false;
  if (bVar1) {
    wasm::Literal::Literal(&local_68,candidate);
    local_8a = Components<wasm::Match::Internal::LitKind<wasm::Match::Internal::BoolLK>,_1,_void>::
               match(&local_68);
  }
  candidate_local._7_1_ = local_8a;
  if (bVar1) {
    wasm::Literal::~Literal(&local_68);
  }
  wasm::Literal::~Literal(&local_40);
  return (bool)(candidate_local._7_1_ & 1);
}

Assistant:

static inline bool
  match(matched_t<Kind> candidate,
        SubMatchers<CurrMatcher, NextMatchers...>& matchers) {
    return matchers.curr.matches(GetComponent<Kind, pos>{}(candidate)) &&
           Components<Kind, pos + 1, NextMatchers...>::match(candidate,
                                                             matchers.next);
  }